

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98ml_parse.c
# Opt level: O0

long yytnamerr(char *yyres,char *yystr)

{
  char cVar1;
  char *pcVar2;
  char *local_30;
  char *yyp;
  long yyn;
  char *yystr_local;
  char *yyres_local;
  
  if (*yystr == '\"') {
    yyp = (char *)0x0;
    local_30 = yystr;
    while( true ) {
      cVar1 = local_30[1];
      if (cVar1 == '\"') break;
      if (((cVar1 == '\'') || (cVar1 == ',')) ||
         ((pcVar2 = local_30 + 1, cVar1 == '\\' && (pcVar2 = local_30 + 2, local_30[2] != '\\'))))
      goto LAB_00104f94;
      local_30 = pcVar2;
      if (yyres != (char *)0x0) {
        yyres[(long)yyp] = *local_30;
      }
      yyp = yyp + 1;
    }
    if (yyres != (char *)0x0) {
      yyres[(long)yyp] = '\0';
    }
    yyres_local = yyp;
  }
  else {
LAB_00104f94:
    if (yyres == (char *)0x0) {
      yyres_local = (char *)strlen(yystr);
    }
    else {
      pcVar2 = yystpcpy(yyres,yystr);
      yyres_local = pcVar2 + -(long)yyres;
    }
  }
  return (long)yyres_local;
}

Assistant:

static YYPTRDIFF_T
yytnamerr (char *yyres, const char *yystr)
{
  if (*yystr == '"')
    {
      YYPTRDIFF_T yyn = 0;
      char const *yyp = yystr;
      for (;;)
        switch (*++yyp)
          {
          case '\'':
          case ',':
            goto do_not_strip_quotes;

          case '\\':
            if (*++yyp != '\\')
              goto do_not_strip_quotes;
            else
              goto append;

          append:
          default:
            if (yyres)
              yyres[yyn] = *yyp;
            yyn++;
            break;

          case '"':
            if (yyres)
              yyres[yyn] = '\0';
            return yyn;
          }
    do_not_strip_quotes: ;
    }

  if (yyres)
    return yystpcpy (yyres, yystr) - yyres;
  else
    return yystrlen (yystr);
}